

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

int64_t __thiscall mkvmuxer::Cluster::GetRelativeTimecode(Cluster *this,int64_t abs_timecode)

{
  uint64_t uVar1;
  long in_RSI;
  Cluster *in_RDI;
  int64_t rel_timecode;
  int64_t cluster_timecode;
  undefined8 local_8;
  
  uVar1 = timecode(in_RDI);
  local_8 = in_RSI - uVar1;
  if ((local_8 < 0) || (0x7fff < local_8)) {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

int64_t Cluster::GetRelativeTimecode(int64_t abs_timecode) const {
  const int64_t cluster_timecode = this->Cluster::timecode();
  const int64_t rel_timecode =
      static_cast<int64_t>(abs_timecode) - cluster_timecode;

  if (rel_timecode < 0 || rel_timecode > kMaxBlockTimecode)
    return -1;

  return rel_timecode;
}